

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_hmc_multiple_val.cpp
# Opt level: O2

int BoxMuller(double *p,double *q)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = rand();
  iVar2 = rand();
  dVar3 = log((double)iVar1 / 2147483647.0);
  dVar3 = dVar3 * -2.0;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar4 = ((double)iVar2 / 2147483647.0) * 6.283185307179586;
  dVar5 = sin(dVar4);
  *p = dVar5 * dVar3;
  dVar3 = log((double)iVar1 / 2147483647.0);
  dVar3 = dVar3 * -2.0;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar4 = cos(dVar4);
  *q = dVar4 * dVar3;
  return 0;
}

Assistant:

int BoxMuller(double &p, double &q) {
    double pi = 2e0 * asin(1e0);
    double r = (double) rand() / RAND_MAX;
    double s = (double) rand() / RAND_MAX;

    p = sqrt(-2e0 * log(r)) * sin(2e0 * pi * s);
    q = sqrt(-2e0 * log(r)) * cos(2e0 * pi * s);

    return 0;
}